

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O0

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false>::set_paging<1>
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false> *this)

{
  Region RVar1;
  MainState MVar2;
  MainState *pMVar3;
  uint8_t *local_98;
  uint8_t *local_88;
  uint8_t *local_80;
  uint8_t *local_70;
  uint8_t *local_68;
  uint8_t *local_58;
  uint8_t *local_50;
  uint8_t *local_40;
  uint8_t *local_38;
  uint8_t *local_28;
  MainState state;
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false> *this_local;
  
  pMVar3 = AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false>_>
           ::main_state(&this->auxiliary_switches_);
  MVar2 = *pMVar3;
  RVar1 = pMVar3->region_20_40;
  if (((uint6)MVar2 & 1) == 0) {
    local_28 = this->ram_;
  }
  else {
    local_28 = this->aux_ram_;
  }
  local_28 = local_28 + 0x200;
  if (((uint6)MVar2 & 0x100) == 0) {
    local_38 = this->ram_;
  }
  else {
    local_38 = this->aux_ram_;
  }
  local_38 = local_38 + 0x200;
  page(this,2,4,local_28,local_38);
  if (((uint6)MVar2 & 1) == 0) {
    local_40 = this->ram_;
  }
  else {
    local_40 = this->aux_ram_;
  }
  local_40 = local_40 + 0x800;
  if (((uint6)MVar2 & 0x100) == 0) {
    local_50 = this->ram_;
  }
  else {
    local_50 = this->aux_ram_;
  }
  local_50 = local_50 + 0x800;
  page(this,8,0x20,local_40,local_50);
  if (((uint6)MVar2 & 1) == 0) {
    local_58 = this->ram_;
  }
  else {
    local_58 = this->aux_ram_;
  }
  local_58 = local_58 + 0x4000;
  if (((uint6)MVar2 & 0x100) == 0) {
    local_68 = this->ram_;
  }
  else {
    local_68 = this->aux_ram_;
  }
  local_68 = local_68 + 0x4000;
  page(this,0x40,0xc0,local_58,local_68);
  if (((uint6)MVar2 & 0x10000) == 0) {
    local_70 = this->ram_;
  }
  else {
    local_70 = this->aux_ram_;
  }
  local_70 = local_70 + 0x400;
  if (((uint6)MVar2 & 0x1000000) == 0) {
    local_80 = this->ram_;
  }
  else {
    local_80 = this->aux_ram_;
  }
  local_80 = local_80 + 0x400;
  page(this,4,8,local_70,local_80);
  if (((ushort)RVar1 & 1) == 0) {
    local_88 = this->ram_;
  }
  else {
    local_88 = this->aux_ram_;
  }
  local_88 = local_88 + 0x2000;
  if (((ushort)RVar1 & 0x100) == 0) {
    local_98 = this->ram_;
  }
  else {
    local_98 = this->aux_ram_;
  }
  local_98 = local_98 + 0x2000;
  page(this,0x20,0x40,local_88,local_98);
  return;
}

Assistant:

void set_paging() {
			if constexpr (bool(type & PagingType::ZeroPage)) {
				if(auxiliary_switches_.zero_state()) {
					write_pages_[0] = aux_ram_;
				} else {
					write_pages_[0] = ram_;
				}
				write_pages_[1] = write_pages_[0] + 256;
				read_pages_[0] = write_pages_[0];
				read_pages_[1] = write_pages_[1];
			}

			if constexpr (bool(type & (PagingType::LanguageCard | PagingType::ZeroPage))) {
				const auto language_state = language_card_.state();
				const auto zero_state = auxiliary_switches_.zero_state();

				uint8_t *const ram = zero_state ? aux_ram_ : ram_;
				uint8_t *const rom = is_iie(model) ? &rom_[3840] : rom_.data();

				// Which way the region here is mapped to be banks 1 and 2 is
				// arbitrary.
				page(0xd0, 0xe0,
					language_state.read ? &ram[language_state.bank2 ? 0xd000 : 0xc000] : rom,
					language_state.write ? nullptr : &ram[language_state.bank2 ? 0xd000 : 0xc000]);

				page(0xe0, 0x100,
					language_state.read ? &ram[0xe000] : &rom[0x1000],
					language_state.write ? nullptr : &ram[0xe000]);
			}

			if constexpr (bool(type & PagingType::CardArea)) {
				const auto state = auxiliary_switches_.card_state();

				page(0xc1, 0xc4, state.region_C1_C3 ? &rom_[0xc100 - 0xc100] : nullptr, nullptr);
				read_pages_[0xc3] = state.region_C3 ? &rom_[0xc300 - 0xc100] : nullptr;
				page(0xc4, 0xc8, state.region_C4_C8 ? &rom_[0xc400 - 0xc100] : nullptr, nullptr);
				page(0xc8, 0xd0, state.region_C8_D0 ? &rom_[0xc800 - 0xc100] : nullptr, nullptr);
			}

			if constexpr (bool(type & PagingType::Main)) {
				const auto state = auxiliary_switches_.main_state();

				page(0x02, 0x04,
					state.base.read ? &aux_ram_[0x0200] : &ram_[0x0200],
					state.base.write ? &aux_ram_[0x0200] : &ram_[0x0200]);
				page(0x08, 0x20,
					state.base.read ? &aux_ram_[0x0800] : &ram_[0x0800],
					state.base.write ? &aux_ram_[0x0800] : &ram_[0x0800]);
				page(0x40, 0xc0,
					state.base.read ? &aux_ram_[0x4000] : &ram_[0x4000],
					state.base.write ? &aux_ram_[0x4000] : &ram_[0x4000]);

				page(0x04, 0x08,
					state.region_04_08.read ? &aux_ram_[0x0400] : &ram_[0x0400],
					state.region_04_08.write ? &aux_ram_[0x0400] : &ram_[0x0400]);

				page(0x20, 0x40,
					state.region_20_40.read ? &aux_ram_[0x2000] : &ram_[0x2000],
					state.region_20_40.write ? &aux_ram_[0x2000] : &ram_[0x2000]);
			}
		}